

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O1

_Bool opensshcert_check_cert
                (ssh_key *key,_Bool host,ptrlen principal,uint64_t time,ca_options *opts,
                BinarySink *error)

{
  opensshcert_key *ck;
  ssh_keyalg *psVar1;
  ptrlen pVar2;
  ptrlen pVar3;
  _Bool _Var4;
  strbuf *buf_o;
  ssh_key *psVar5;
  byte bVar6;
  int iVar7;
  char *pcVar8;
  BinarySink *pBVar9;
  char *pcVar10;
  ptrlen pVar11;
  BinarySource src [1];
  BinarySource local_68;
  ssh_keyalg *local_38;
  
  bVar6 = (byte)principal.len;
  ck = (opensshcert_key *)(key + -0xd);
  local_38 = (ssh_keyalg *)time;
  buf_o = strbuf_new();
  psVar1 = key[-2].vt;
  pVar2.ptr = psVar1->new_priv;
  pVar2.len = (size_t)psVar1->new_priv_openssh;
  pVar11.ptr = psVar1->new_priv;
  pVar11.len = (size_t)psVar1->new_priv_openssh;
  psVar5 = opensshcert_ca_pub_key(ck,(ptrlen)ZEXT816(0),(ptrlen *)0x0);
  if (psVar5 == (ssh_key *)0x0) {
    pBVar9 = error->binarysink_;
    pcVar8 = "Certificate\'s signing key is invalid";
LAB_001621c6:
    psVar5 = (ssh_key *)0x0;
    BinarySink_put_fmt(pBVar9,pcVar8);
    goto LAB_001621d2;
  }
  if (psVar5->vt->is_certificate == true) {
    pBVar9 = error->binarysink_;
    pcVar8 = 
    "Certificate is signed with a certified key (forbidden by OpenSSH certificate specification)";
    goto LAB_001620bd;
  }
  (*psVar5->vt->freekey)(psVar5);
  psVar5 = opensshcert_ca_pub_key(ck,pVar11,(ptrlen *)0x0);
  if (psVar5 == (ssh_key *)0x0) {
    pBVar9 = error->binarysink_;
    pcVar8 = "Certificate\'s signing key does not match signature type";
    goto LAB_001621c6;
  }
  psVar1 = psVar5->vt;
  if ((((psVar1 == &ssh_rsa) && (opts->permit_rsa_sha1 != true)) ||
      ((psVar1 == &ssh_rsa_sha256 && (opts->permit_rsa_sha256 != true)))) ||
     ((psVar1 == &ssh_rsa_sha512 && (opts->permit_rsa_sha512 == false)))) {
    BinarySink_put_fmt(error->binarysink_,
                       "Certificate signature uses \'%s\' signature type (forbidden by user configuration)"
                       ,psVar1->ssh_id);
    goto LAB_001621d2;
  }
  opensshcert_signature_preimage(ck,buf_o->binarysink_);
  pVar3.ptr = buf_o->u;
  pVar3.len = buf_o->len;
  _Var4 = (*psVar5->vt->verify)(psVar5,pVar2,pVar3);
  psVar1 = local_38;
  if (_Var4) {
    if (*(int *)&key[-0xb].vt == host + 1) {
      if (local_38 < key[-8].vt) {
        pBVar9 = error->binarysink_;
        pcVar8 = "Certificate is not valid until ";
      }
      else {
        if (local_38 < key[-7].vt) {
          local_68.len = (size_t)(key[-9].vt)->new_priv_openssh;
          if ((_func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *)local_68.len !=
              (_func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *)0x0) {
            local_68.data = (key[-9].vt)->new_priv;
            local_68.pos = 0;
            local_68.err = BSE_NO_ERROR;
            local_68.binarysource_ = &local_68;
LAB_001622ca:
            if ((local_68.binarysource_)->len != (local_68.binarysource_)->pos)
            goto code_r0x001622dd;
            pcVar8 = "username";
            if (host) {
              pcVar8 = "hostname";
            }
            BinarySink_put_fmt(error->binarysink_,"Certificate\'s %s list [");
            local_68.data = (key[-9].vt)->new_priv;
            local_68.len = (size_t)(key[-9].vt)->new_priv_openssh;
            local_68.pos = 0;
            local_68.err = BSE_NO_ERROR;
            local_68.binarysource_ = &local_68;
            if ((_func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *)local_68.len !=
                (_func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *)0x0) {
              pcVar10 = anon_var_dwarf_32abb + 10;
              do {
                pVar11 = BinarySource_get_string(local_68.binarysource_);
                BinarySink_put_fmt(error->binarysink_,"%s\"",pcVar10);
                BinarySink_put_c_string_literal(error->binarysink_,pVar11);
                BinarySink_put_fmt(error->binarysink_,"\"");
                pcVar10 = ", ";
              } while ((local_68.binarysource_)->len != (local_68.binarysource_)->pos);
            }
            BinarySink_put_fmt(error->binarysink_,"] does not contain expected %s \"",pcVar8);
            pBVar9 = error->binarysink_;
            goto LAB_00162546;
          }
          goto LAB_001623b0;
        }
        pBVar9 = error->binarysink_;
        pcVar8 = "Certificate expired at ";
      }
      bVar6 = 0;
      BinarySink_put_fmt(pBVar9,pcVar8);
      opensshcert_time_to_iso8601(error->binarysink_,(uint64_t)psVar1);
    }
    else {
      BinarySink_put_fmt(error->binarysink_,"Certificate type is ");
      if (*(int *)&key[-0xb].vt == 1) {
        pcVar8 = "user";
LAB_00162344:
        BinarySink_put_fmt(error->binarysink_,pcVar8);
      }
      else {
        if (*(int *)&key[-0xb].vt == 2) {
          pcVar8 = "host";
          goto LAB_00162344;
        }
        BinarySink_put_fmt(error->binarysink_,"unknown value %u");
      }
      pcVar8 = "user";
      if (host) {
        pcVar8 = "host";
      }
      bVar6 = 0;
      BinarySink_put_fmt(error->binarysink_,"; expected %s",pcVar8);
    }
  }
  else {
    bVar6 = 0;
    BinarySink_put_fmt(error->binarysink_,"Certificate\'s signature is invalid");
  }
  goto LAB_001621d7;
code_r0x001622dd:
  pVar11 = BinarySource_get_string(local_68.binarysource_);
  if ((local_68.binarysource_)->err == BSE_NO_ERROR) {
    _Var4 = ptrlen_eq_ptrlen(pVar11,principal);
    iVar7 = 6;
    if (!_Var4) {
      iVar7 = 0;
    }
  }
  else {
    BinarySink_put_fmt(error->binarysink_,
                       "Certificate\'s valid principals list is incorrectly formatted");
    iVar7 = 2;
  }
  if (iVar7 != 0) goto code_r0x00162325;
  goto LAB_001622ca;
code_r0x00162325:
  if (iVar7 != 2) {
    if (iVar7 == 4) goto LAB_001621ed;
LAB_001623b0:
    local_68.data = (key[-6].vt)->new_priv;
    local_68.len = (size_t)(key[-6].vt)->new_priv_openssh;
    local_68.binarysource_ = &local_68;
    local_68.pos = 0;
    local_68.err = BSE_NO_ERROR;
    if ((_func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *)local_68.len ==
        (_func_ssh_key_ptr_ssh_keyalg_ptr_BinarySource_ptr *)0x0) {
      bVar6 = 1;
      goto LAB_001621d7;
    }
    principal = BinarySource_get_string(&local_68);
    pVar11 = BinarySource_get_string(local_68.binarysource_);
    if ((local_68.binarysource_)->err == BSE_NO_ERROR) {
      BinarySink_put_fmt(error->binarysink_,
                         "Certificate specifies an unsupported critical option \"",pVar11.len);
      pBVar9 = error->binarysink_;
LAB_00162546:
      BinarySink_put_c_string_literal(pBVar9,principal);
      pBVar9 = error->binarysink_;
      pcVar8 = "\"";
    }
    else {
      pBVar9 = error->binarysink_;
      pcVar8 = "Certificate\'s critical options list is incorrectly formatted";
    }
LAB_001620bd:
    BinarySink_put_fmt(pBVar9,pcVar8);
  }
LAB_001621d2:
  bVar6 = 0;
LAB_001621d7:
  if (psVar5 != (ssh_key *)0x0) {
    (*psVar5->vt->freekey)(psVar5);
  }
  strbuf_free(buf_o);
LAB_001621ed:
  return (_Bool)(bVar6 & 1);
}

Assistant:

static bool opensshcert_check_cert(
    ssh_key *key, bool host, ptrlen principal, uint64_t time,
    const ca_options *opts, BinarySink *error)
{
    opensshcert_key *ck = container_of(key, opensshcert_key, sshk);
    bool result = false;
    ssh_key *ca_key = NULL;
    strbuf *preimage = strbuf_new();
    BinarySource src[1];

    ptrlen signature = ptrlen_from_strbuf(ck->signature);

    /*
     * The OpenSSH certificate spec is one-layer only: it explicitly
     * forbids using a certified key in turn as the CA.
     *
     * If it did not, then we'd also have to recursively verify
     * everything up the CA chain until we reached the ultimate root,
     * and then make sure _that_ was something we trusted. (Not to
     * mention that there'd probably be an additional SSH_CERT_TYPE_CA
     * or some such, and certificate options saying what kinds of
     * certificate a CA was trusted to sign for, and ...)
     */
    ca_key = opensshcert_ca_pub_key(ck, make_ptrlen(NULL, 0), NULL);
    if (!ca_key) {
        put_fmt(error, "Certificate's signing key is invalid");
        goto out;
    }
    if (ssh_key_alg(ca_key)->is_certificate) {
        put_fmt(error, "Certificate is signed with a certified key "
                "(forbidden by OpenSSH certificate specification)");
        goto out;
    }

    /*
     * Now re-instantiate the key in a way that matches the signature
     * (i.e. so that if the key is an RSA one we get the right subtype
     * of RSA).
     */
    ssh_key_free(ca_key);
    ca_key = opensshcert_ca_pub_key(ck, signature, NULL);
    if (!ca_key) {
        put_fmt(error, "Certificate's signing key does not match "
                "signature type");
        goto out;
    }

    /* Check which signature algorithm is actually in use, because
     * that might be a reason to reject the certificate (e.g. ssh-rsa
     * when we wanted rsa-sha2-*). */
    const ssh_keyalg *sig_alg = ssh_key_alg(ca_key);
    if ((sig_alg == &ssh_rsa && !opts->permit_rsa_sha1) ||
        (sig_alg == &ssh_rsa_sha256 && !opts->permit_rsa_sha256) ||
        (sig_alg == &ssh_rsa_sha512 && !opts->permit_rsa_sha512)) {
        put_fmt(error, "Certificate signature uses '%s' signature type "
                "(forbidden by user configuration)", sig_alg->ssh_id);
        goto out;
    }

    opensshcert_signature_preimage(ck, BinarySink_UPCAST(preimage));

    if (!ssh_key_verify(ca_key, signature, ptrlen_from_strbuf(preimage))) {
        put_fmt(error, "Certificate's signature is invalid");
        goto out;
    }

    uint32_t expected_type = host ? SSH_CERT_TYPE_HOST : SSH_CERT_TYPE_USER;
    if (ck->type != expected_type) {
        put_fmt(error, "Certificate type is ");
        switch (ck->type) {
          case SSH_CERT_TYPE_HOST:
            put_fmt(error, "host");
            break;
          case SSH_CERT_TYPE_USER:
            put_fmt(error, "user");
            break;
          default:
            put_fmt(error, "unknown value %" PRIu32, ck->type);
            break;
        }
        put_fmt(error, "; expected %s", host ? "host" : "user");
        goto out;
    }

    /*
     * Check the time bounds on the certificate.
     */
    if (time < ck->valid_after) {
        put_fmt(error, "Certificate is not valid until ");
        opensshcert_time_to_iso8601(BinarySink_UPCAST(error), time);
        goto out;
    }
    if (time >= ck->valid_before) {
        put_fmt(error, "Certificate expired at ");
        opensshcert_time_to_iso8601(BinarySink_UPCAST(error), time);
        goto out;
    }

    /*
     * Check that this certificate is for the right thing.
     *
     * If valid_principals is a zero-length string then this is
     * specified to be a carte-blanche certificate valid for any
     * principal (at least, provided you trust the CA that issued it).
     */
    if (ck->valid_principals->len != 0) {
        BinarySource_BARE_INIT_PL(
            src, ptrlen_from_strbuf(ck->valid_principals));

        while (get_avail(src)) {
            ptrlen valid_principal = get_string(src);
            if (get_err(src)) {
                put_fmt(error, "Certificate's valid principals list is "
                        "incorrectly formatted");
                goto out;
            }
            if (ptrlen_eq_ptrlen(valid_principal, principal))
                goto principal_ok;
        }

        /*
         * No valid principal matched. Now go through the list a
         * second time writing the cert contents into the error
         * message, so that the user can see at a glance what went
         * wrong.
         *
         * (If you've typed the wrong spelling of the host name, you
         * really need to see "This cert is for 'foo.example.com' and
         * I was trying to match it against 'foo'", rather than just
         * "Computer says no".)
         */
        put_fmt(error, "Certificate's %s list [",
                host ? "hostname" : "username");
        BinarySource_BARE_INIT_PL(
            src, ptrlen_from_strbuf(ck->valid_principals));
        const char *sep = "";
        while (get_avail(src)) {
            ptrlen valid_principal = get_string(src);
            put_fmt(error, "%s\"", sep);
            put_c_string_literal(error, valid_principal);
            put_fmt(error, "\"");
            sep = ", ";
        }
        put_fmt(error, "] does not contain expected %s \"",
                host ? "hostname" : "username");
        put_c_string_literal(error, principal);
        put_fmt(error, "\"");
        goto out;
      principal_ok:;
    }

    /*
     * Check for critical options.
     */
    {
        BinarySource_BARE_INIT_PL(
            src, ptrlen_from_strbuf(ck->critical_options));

        while (get_avail(src)) {
            ptrlen option = get_string(src);
            ptrlen data = get_string(src);
            if (get_err(src)) {
                put_fmt(error, "Certificate's critical options list is "
                        "incorrectly formatted");
                goto out;
            }

            /*
             * If we ever do support any options, this will be where
             * we insert code to recognise and validate them.
             *
             * At present, we implement no critical options at all.
             * (For host certs, as of 2022-04-20, OpenSSH hasn't
             * defined any. For user certs, the only SSH server using
             * this is Uppity, which doesn't support key restrictions
             * in general.)
             */
            (void)data; /* no options supported => no use made of the data */

            /*
             * Report an unrecognised literal.
             */
            put_fmt(error, "Certificate specifies an unsupported critical "
                    "option \"");
            put_c_string_literal(error, option);
            put_fmt(error, "\"");
            goto out;
        }
    }

    /* If we get here without failing any check, accept the certificate! */
    result = true;

  out:
    if (ca_key)
        ssh_key_free(ca_key);
    strbuf_free(preimage);
    return result;
}